

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTArithmeticExpression.cpp
# Opt level: O3

void __thiscall
MathML::AST::ArithmeticExpression::setOperator(ArithmeticExpression *this,String *op)

{
  size_t __n;
  int iVar1;
  Operator OVar2;
  
  __n = op->_M_string_length;
  if ((((__n != _DAT_009e0a98) ||
       ((OVar2 = ADD, __n != 0 &&
        (iVar1 = bcmp((op->_M_dataplus)._M_p,OPERATOR_ARITHMETIC_ADD_abi_cxx11_,__n), iVar1 != 0))))
      && ((__n != DAT_009e0ab8 ||
          ((OVar2 = SUB, __n != 0 &&
           (iVar1 = bcmp((op->_M_dataplus)._M_p,OPERATOR_ARITHMETIC_SUB_abi_cxx11_,__n), iVar1 != 0)
           ))))) &&
     ((__n != DAT_009e0ad8 ||
      ((OVar2 = MUL, __n != 0 &&
       (iVar1 = bcmp((op->_M_dataplus)._M_p,OPERATOR_ARITHMETIC_MUL_abi_cxx11_,__n), iVar1 != 0)))))
     ) {
    if (__n != DAT_009e0af8) {
      return;
    }
    OVar2 = DIV;
    if ((__n != 0) &&
       (iVar1 = bcmp((op->_M_dataplus)._M_p,OPERATOR_ARITHMETIC_DIV_abi_cxx11_,__n), iVar1 != 0)) {
      return;
    }
  }
  this->mOperator = OVar2;
  return;
}

Assistant:

void ArithmeticExpression::setOperator( const String& op )
        {
            if ( op == OPERATOR_ARITHMETIC_ADD )
            {
                mOperator = ADD;
            }

            else if ( op == OPERATOR_ARITHMETIC_SUB )
            {
                mOperator = SUB;
            }

            else if ( op == OPERATOR_ARITHMETIC_MUL )
            {
                mOperator = MUL;
            }

            else if ( op == OPERATOR_ARITHMETIC_DIV )
            {
                mOperator = DIV;
            }
        }